

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

bool __thiscall argo::pointer::next_token(pointer *this,string *pointer,size_t *start,size_t *end)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  size_t *end_local;
  size_t *start_local;
  string *pointer_local;
  pointer *this_local;
  
  uVar1 = *start;
  uVar2 = std::__cxx11::string::size();
  if (uVar1 < uVar2) {
    *end = *start + 1;
    while ((uVar1 = *end, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2 &&
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pointer), *pcVar3 != '/'))) {
      *end = *end + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool pointer::next_token(const string &pointer, size_t &start, size_t &end)
{
    if (start >= pointer.size())
    {
        return false;
    }
    else
    {
        end = start + 1;

        while (end < pointer.size())
        {
            if (pointer[end] == '/')
            {
                break;
            }
            else
            {
                end++;
            }
        }

        return true;
    }
}